

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbBLXOffset(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  int32_t iVar2;
  int imm32;
  uint tmp;
  uint I2;
  uint I1;
  uint J2;
  uint J1;
  uint S;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  
  uVar1 = Val >> 0x17 & 1;
  iVar2 = SignExtend32((Val & 0xff9fffff | (uint)(((Val >> 0x16 & 1) != uVar1 ^ 0xffU) & 1) << 0x16
                       | (uint)(((Val >> 0x15 & 1) != uVar1 ^ 0xffU) & 1) << 0x15) << 1,0x19);
  MCOperand_CreateImm0(Inst,(long)iVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeThumbBLXOffset(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	// Val is passed in as S:J1:J2:imm10H:imm10L:'0'
	// Note only one trailing zero not two.  Also the J1 and J2 values are from
	// the encoded instruction.  So here change to I1 and I2 values via:
	// I1 = NOT(J1 EOR S);
	// I2 = NOT(J2 EOR S);
	// and build the imm32 with two trailing zeros as documented:
	// imm32 = SignExtend(S:I1:I2:imm10H:imm10L:'00', 32);
	unsigned S = (Val >> 23) & 1;
	unsigned J1 = (Val >> 22) & 1;
	unsigned J2 = (Val >> 21) & 1;
	unsigned I1 = !(J1 ^ S);
	unsigned I2 = !(J2 ^ S);
	unsigned tmp = (Val & ~0x600000) | (I1 << 22) | (I2 << 21);
	int imm32 = SignExtend32(tmp << 1, 25);

	MCOperand_CreateImm0(Inst, imm32);
	return MCDisassembler_Success;
}